

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

void __thiscall CLI::App::App(App *this,string *app_description,string *app_name)

{
  allocator<char> local_92;
  allocator<char> local_91;
  string local_90;
  string local_70;
  string local_50;
  string local_30;
  
  ::std::__cxx11::string::string((string *)&local_30,(string *)app_description);
  ::std::__cxx11::string::string((string *)&local_50,(string *)app_name);
  App(this,&local_30,&local_50,(App *)0x0);
  ::std::__cxx11::string::~string((string *)&local_50);
  ::std::__cxx11::string::~string((string *)&local_30);
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"-h,--help",&local_91);
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"Print this help message and exit",&local_92);
  set_help_flag(this,&local_70,&local_90);
  ::std::__cxx11::string::~string((string *)&local_90);
  ::std::__cxx11::string::~string((string *)&local_70);
  return;
}

Assistant:

explicit App(std::string app_description = "", std::string app_name = "")
        : App(app_description, app_name, nullptr) {
        set_help_flag("-h,--help", "Print this help message and exit");
    }